

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O1

bool __thiscall QFileDevice::flush(QFileDevice *this)

{
  QObjectData *pQVar1;
  QBindingStatus *pQVar2;
  QBindingStatus *pQVar3;
  char cVar4;
  bool bVar5;
  FileError FVar6;
  void *__ptr;
  FileError FVar7;
  char *pcVar8;
  void *pvVar9;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  pQVar2 = pQVar1[4].bindingStorage.bindingStatus;
  if (pQVar2 == (QBindingStatus *)0x0) {
    flush();
  }
  else {
    pQVar3 = pQVar1[1].bindingStorage.bindingStatus;
    if ((pQVar3 == (QBindingStatus *)0x0) ||
       (pQVar3->groupUpdateData == (QPropertyDelayedNotifications *)0x0)) {
LAB_00238784:
      cVar4 = (*(code *)((pQVar1[4].bindingStorage.bindingStatus)->currentlyEvaluatingBinding->
                        alreadyCaptureProperties).
                        super_QVLABase<const_QtPrivate::QPropertyBindingData_*>.super_QVLABaseBase.s
              )();
      bVar5 = true;
      if (cVar4 != '\0') goto LAB_00238806;
    }
    else {
      if ((pQVar3 == (QBindingStatus *)0x0) ||
         (pQVar3->groupUpdateData == (QPropertyDelayedNotifications *)0x0)) {
        pvVar9 = (void *)0x0;
      }
      else {
        pvVar9 = (void *)((long)pQVar3->currentCompatProperty->bindingState -
                         (long)pQVar3->currentCompatProperty->currentlyEvaluatingBindingList);
      }
      if ((pQVar3 == (QBindingStatus *)0x0) ||
         (pQVar3->groupUpdateData == (QPropertyDelayedNotifications *)0x0)) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar8 = (char *)pQVar3->currentCompatProperty->previousState;
        if ((CompatPropertySafePoint *)pcVar8 == (CompatPropertySafePoint *)0x0) {
          pcVar8 = "";
        }
        pcVar8 = (char *)((long)&((CompatPropertySafePoint *)pcVar8)->property +
                         (long)pQVar3->currentCompatProperty->currentlyEvaluatingBindingList);
      }
      __ptr = (void *)(**(code **)(pQVar2->currentlyEvaluatingBinding[2].alreadyCaptureProperties.
                                   super_QVLAStorage<8UL,_8UL,_8LL>.array + 0x18))
                                (pQVar2,pcVar8,pvVar9);
      if (0 < (long)__ptr) {
        QRingBuffer::free((QRingBuffer *)pQVar1[1].bindingStorage.bindingStatus,__ptr);
      }
      if (__ptr == pvVar9) goto LAB_00238784;
    }
    FVar6 = QAbstractFileEngine::error
                      ((QAbstractFileEngine *)pQVar1[4].bindingStorage.bindingStatus);
    FVar7 = WriteError;
    if (FVar6 != UnspecifiedError) {
      FVar7 = FVar6;
    }
    QAbstractFileEngine::errorString
              (&local_40,(QAbstractFileEngine *)pQVar1[4].bindingStorage.bindingStatus);
    *(FileError *)((long)&pQVar1[5].q_ptr + 4) = FVar7;
    QString::operator=((QString *)&pQVar1[4].children.d.size,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  bVar5 = false;
LAB_00238806:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDevice::flush()
{
    Q_D(QFileDevice);
    if (!d->fileEngine) {
        qWarning("QFileDevice::flush: No file engine. Is IODevice open?");
        return false;
    }

    if (!d->writeBuffer.isEmpty()) {
        qint64 size = d->writeBuffer.nextDataBlockSize();
        qint64 written = d->fileEngine->write(d->writeBuffer.readPointer(), size);
        if (written > 0)
            d->writeBuffer.free(written);
        if (written != size) {
            QFileDevice::FileError err = d->fileEngine->error();
            if (err == QFileDevice::UnspecifiedError)
                err = QFileDevice::WriteError;
            d->setError(err, d->fileEngine->errorString());
            return false;
        }
    }

    if (!d->fileEngine->flush()) {
        QFileDevice::FileError err = d->fileEngine->error();
        if (err == QFileDevice::UnspecifiedError)
            err = QFileDevice::WriteError;
        d->setError(err, d->fileEngine->errorString());
        return false;
    }
    return true;
}